

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

double __thiscall
opengv::absolute_pose::modules::Epnp::compute_R_and_t
          (Epnp *this,MatrixXd *Ut,double *betas,double (*R) [3],double *t)

{
  double dVar1;
  
  compute_ccs(this,betas,Ut);
  compute_pcs(this);
  solve_for_sign(this);
  estimate_R_and_t(this,R,t);
  dVar1 = reprojection_error(this,R,t);
  return dVar1;
}

Assistant:

double
opengv::absolute_pose::modules::Epnp::compute_R_and_t(
    const Eigen::MatrixXd & Ut,
    const double * betas,
    double R[3][3],
    double t[3])
{
  compute_ccs(betas, Ut);
  compute_pcs();

  solve_for_sign();

  estimate_R_and_t(R, t);

  return reprojection_error(R, t);
}